

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.h
# Opt level: O3

void __thiscall
CDiskBlockIndex::SerializationOps<DataStream,CDiskBlockIndex,ActionUnserialize>
          (CDiskBlockIndex *this,DataStream *obj,undefined8 param_3,size_t param_4)

{
  int iVar1;
  uint uVar2;
  long in_FS_OFFSET;
  uint32_t obj_1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock0;
  uint32_t local_2c;
  unique_lock<std::recursive_mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._M_device = &cs_main.super_recursive_mutex;
  local_28._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_28);
  ReadVarInt<DataStream,(VarIntMode)1,int>(obj);
  iVar1 = ReadVarInt<DataStream,(VarIntMode)1,int>(obj);
  (this->super_CBlockIndex).nHeight = iVar1;
  uVar2 = ReadVarInt<DataStream,(VarIntMode)0,unsigned_int>(obj);
  (this->super_CBlockIndex).nStatus = uVar2;
  uVar2 = ReadVarInt<DataStream,(VarIntMode)0,unsigned_int>(obj);
  (this->super_CBlockIndex).nTx = uVar2;
  uVar2 = (this->super_CBlockIndex).nStatus;
  if ((uVar2 & 0x18) != 0) {
    iVar1 = ReadVarInt<DataStream,(VarIntMode)1,int>(obj);
    (this->super_CBlockIndex).nFile = iVar1;
    uVar2 = (this->super_CBlockIndex).nStatus;
  }
  if ((uVar2 & 8) != 0) {
    uVar2 = ReadVarInt<DataStream,(VarIntMode)0,unsigned_int>(obj);
    (this->super_CBlockIndex).nDataPos = uVar2;
    uVar2 = (this->super_CBlockIndex).nStatus;
  }
  if ((uVar2 & 0x10) != 0) {
    uVar2 = ReadVarInt<DataStream,(VarIntMode)0,unsigned_int>(obj);
    (this->super_CBlockIndex).nUndoPos = uVar2;
  }
  DataStream::read(obj,(int)&local_2c,(void *)0x4,param_4);
  (this->super_CBlockIndex).nVersion = local_2c;
  DataStream::read(obj,(int)this + 0x94,(void *)0x20,param_4);
  DataStream::read(obj,(int)this + 0x60,(void *)0x20,param_4);
  DataStream::read(obj,(int)&local_2c,(void *)0x4,param_4);
  (this->super_CBlockIndex).nTime = local_2c;
  DataStream::read(obj,(int)&local_2c,(void *)0x4,param_4);
  (this->super_CBlockIndex).nBits = local_2c;
  DataStream::read(obj,(int)&local_2c,(void *)0x4,param_4);
  (this->super_CBlockIndex).nNonce = local_2c;
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(CDiskBlockIndex, obj)
    {
        LOCK(::cs_main);
        int _nVersion = DUMMY_VERSION;
        READWRITE(VARINT_MODE(_nVersion, VarIntMode::NONNEGATIVE_SIGNED));

        READWRITE(VARINT_MODE(obj.nHeight, VarIntMode::NONNEGATIVE_SIGNED));
        READWRITE(VARINT(obj.nStatus));
        READWRITE(VARINT(obj.nTx));
        if (obj.nStatus & (BLOCK_HAVE_DATA | BLOCK_HAVE_UNDO)) READWRITE(VARINT_MODE(obj.nFile, VarIntMode::NONNEGATIVE_SIGNED));
        if (obj.nStatus & BLOCK_HAVE_DATA) READWRITE(VARINT(obj.nDataPos));
        if (obj.nStatus & BLOCK_HAVE_UNDO) READWRITE(VARINT(obj.nUndoPos));

        // block header
        READWRITE(obj.nVersion);
        READWRITE(obj.hashPrev);
        READWRITE(obj.hashMerkleRoot);
        READWRITE(obj.nTime);
        READWRITE(obj.nBits);
        READWRITE(obj.nNonce);
    }